

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O3

int set_form_fields(FORM *form,FIELD **fields)

{
  FIELD **fields_00;
  int iVar1;
  int *piVar2;
  
  if (form == (FORM *)0x0) {
    iVar1 = -2;
  }
  else {
    iVar1 = -3;
    if ((form->status & 1) == 0) {
      fields_00 = form->field;
      Disconnect_Fields(form);
      iVar1 = Associate_Fields(form,fields);
      if (iVar1 != 0) {
        Connect_Fields(form,fields_00);
      }
    }
  }
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return iVar1;
}

Assistant:

int set_form_fields(FORM  * form, FIELD ** fields)
{
  FIELD **old;
  int res;
  
  if ( !form )	
    RETURN(E_BAD_ARGUMENT);

  if ( form->status & _POSTED )	
    RETURN(E_POSTED);
  
  old = form->field;
  Disconnect_Fields( form );
  
  if( (res = Associate_Fields( form, fields )) != E_OK )
    Connect_Fields( form, old );
  
  RETURN(res);
}